

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_verify_topo(REF_GRID ref_grid)

{
  int node0;
  REF_NODE pRVar1;
  REF_GEOM ref_geom;
  REF_ADJ pRVar2;
  REF_CELL ref_cell;
  REF_INT *pRVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  char *pcVar9;
  int iVar10;
  REF_INT node;
  long lVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  REF_INT ncell;
  REF_BOOL geom_face;
  REF_BOOL geom_edge;
  REF_BOOL geom_node;
  REF_INT cell_list [2];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  long local_40;
  REF_GLOB *local_38;
  
  pRVar1 = ref_grid->node;
  local_40 = (long)pRVar1->max;
  if (0 < local_40) {
    ref_geom = ref_grid->geom;
    local_38 = pRVar1->global;
    lVar11 = 0;
    do {
      if (local_38[lVar11] < 0) {
        if ((lVar11 < ref_geom->ref_adj->nnode) && (ref_geom->ref_adj->first[lVar11] != -1)) {
          pcVar9 = "invalid node has geom";
          uVar8 = 0x818;
          goto LAB_0014c993;
        }
        goto LAB_0014c21c;
      }
      node = (REF_INT)lVar11;
      ref_geom_is_a(ref_geom,node,0,&local_4c);
      ref_geom_is_a(ref_geom,node,1,&local_50);
      ref_geom_is_a(ref_geom,node,2,&local_54);
      pRVar2 = ref_grid->cell[3]->ref_adj;
      if ((((lVar11 < pRVar2->nnode) && (pRVar2->first[lVar11] != -1)) ||
          ((pRVar2 = ref_grid->cell[4]->ref_adj, lVar11 < pRVar2->nnode &&
           (pRVar2->first[lVar11] != -1)))) ||
         ((pRVar2 = ref_grid->cell[5]->ref_adj, lVar11 < pRVar2->nnode &&
          (pRVar2->first[lVar11] != -1)))) {
        bVar14 = false;
      }
      else {
        pRVar2 = ref_grid->cell[6]->ref_adj;
        bVar14 = true;
        if (lVar11 < pRVar2->nnode) {
          bVar14 = pRVar2->first[lVar11] == -1;
        }
      }
      pRVar2 = ref_grid->cell[0]->ref_adj;
      if (((lVar11 < pRVar2->nnode) && (pRVar2->first[lVar11] != -1)) ||
         ((pRVar2 = ref_grid->cell[1]->ref_adj, lVar11 < pRVar2->nnode &&
          (pRVar2->first[lVar11] != -1)))) {
        bVar13 = false;
LAB_0014c00a:
        if (local_4c == 0) {
          iVar7 = 0;
        }
        else {
          if (bVar13) {
LAB_0014c052:
            bVar13 = true;
            if (pRVar1->ref_mpi->id == pRVar1->part[lVar11]) {
              pcVar9 = "geom node missing edge";
              uVar8 = 0x7c2;
              goto LAB_0014c993;
            }
          }
          else {
            bVar13 = false;
          }
          iVar7 = local_4c;
          if ((bVar14) && (pRVar1->ref_mpi->id == pRVar1->part[lVar11])) {
            pcVar9 = "geom node missing tri or qua";
            uVar8 = 0x7c5;
            goto LAB_0014c993;
          }
        }
        if (local_50 == 0) {
          bVar5 = true;
          bVar4 = false;
          goto LAB_0014c0cf;
        }
        if (bVar13) {
LAB_0014c08f:
          bVar13 = true;
          if (pRVar1->ref_mpi->id == pRVar1->part[lVar11]) {
            uVar6 = ref_grid_tattle(ref_grid,node);
            if (uVar6 == 0) {
              uVar6 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
              if (uVar6 == 0) {
                pcVar9 = "geom edge missing edge";
                uVar8 = 0x7cd;
                goto LAB_0014c993;
              }
              pcVar9 = "geom tec";
              uVar8 = 0x7cc;
            }
            else {
              pcVar9 = "tattle";
              uVar8 = 0x7ca;
            }
            goto LAB_0014c8d4;
          }
        }
        else {
          bVar13 = false;
        }
        if (bVar14) {
          if (pRVar1->ref_mpi->id != pRVar1->part[lVar11]) {
            bVar4 = true;
            bVar5 = false;
            goto LAB_0014c0cf;
          }
          uVar6 = ref_grid_tattle(ref_grid,node);
          if (uVar6 == 0) {
            uVar6 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
            if (uVar6 == 0) {
              pcVar9 = "geom edge missing tri or qua";
              uVar8 = 0x7d3;
              goto LAB_0014c993;
            }
            pcVar9 = "geom tec";
            uVar8 = 0x7d2;
          }
          else {
            pcVar9 = "tattle";
            uVar8 = 2000;
          }
          goto LAB_0014c8d4;
        }
        bVar4 = true;
        bVar5 = false;
      }
      else {
        pRVar2 = ref_grid->cell[2]->ref_adj;
        if (lVar11 < pRVar2->nnode) {
          bVar13 = pRVar2->first[lVar11] == -1;
          goto LAB_0014c00a;
        }
        if (local_4c != 0) goto LAB_0014c052;
        iVar7 = 0;
        if (local_50 != 0) goto LAB_0014c08f;
        bVar5 = true;
        bVar4 = false;
        bVar13 = true;
LAB_0014c0cf:
        if (((bool)(local_54 != 0 & bVar14)) && (pRVar1->ref_mpi->id == pRVar1->part[lVar11])) {
          puts("no face for geom");
          uVar6 = ref_grid_tattle(ref_grid,node);
          if (uVar6 == 0) {
            uVar6 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
            if (uVar6 == 0) {
              pcVar9 = "geom face missing tri or qua";
              uVar8 = 0x7dc;
              goto LAB_0014c993;
            }
            pcVar9 = "geom tec";
            uVar8 = 0x7db;
          }
          else {
            pcVar9 = "tattle";
            uVar8 = 0x7d9;
          }
          goto LAB_0014c8d4;
        }
        if (!bVar13 && !bVar4) {
          puts("no geom for edge");
          uVar6 = ref_grid_tattle(ref_grid,node);
          if (uVar6 == 0) {
            uVar6 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
            if (uVar6 == 0) {
              pcVar9 = "geom edge missing for edg";
              uVar8 = 0x7e5;
              goto LAB_0014c993;
            }
            pcVar9 = "geom tec";
            uVar8 = 0x7e4;
          }
          else {
            pcVar9 = "tattle";
            uVar8 = 0x7e2;
          }
          goto LAB_0014c8d4;
        }
      }
      if ((!bVar14 && local_54 == 0) && (ref_geom->meshlink == (void *)0x0)) {
        puts("no geom for face");
        uVar6 = ref_grid_tattle(ref_grid,node);
        if (uVar6 == 0) {
          uVar6 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
          if (uVar6 == 0) {
            pcVar9 = "geom face missing tri or qua";
            uVar8 = 0x7ee;
            goto LAB_0014c993;
          }
          pcVar9 = "geom tec";
          uVar8 = 0x7ed;
        }
        else {
          pcVar9 = "tattle";
          uVar8 = 0x7eb;
        }
        goto LAB_0014c8d4;
      }
      if (!bVar5 && iVar7 == 0) {
        pRVar2 = ref_geom->ref_adj;
        if ((lVar11 < pRVar2->nnode) && (iVar7 = pRVar2->first[lVar11], iVar7 != -1)) {
          bVar14 = false;
          bVar13 = false;
          do {
            bVar5 = true;
            if (!bVar14) {
              bVar5 = bVar13;
            }
            if (ref_geom->descr[(long)pRVar2->item[iVar7].ref * 6] == 1) {
              bVar14 = true;
              bVar13 = bVar5;
            }
            iVar7 = pRVar2->item[iVar7].next;
          } while (iVar7 != -1);
          if ((bVar14) && (!bVar13)) goto LAB_0014c1a8;
          if (!bVar14) {
            puts("none found");
          }
          if (bVar13) {
            pcVar9 = "found too many";
            goto LAB_0014c4a0;
          }
        }
        else {
          pcVar9 = "none found";
LAB_0014c4a0:
          puts(pcVar9);
        }
        uVar6 = ref_grid_tattle(ref_grid,node);
        if (uVar6 == 0) {
          uVar6 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
          if (uVar6 == 0) {
            pcVar9 = "multiple geom edge away from geom node";
            uVar8 = 0x800;
            goto LAB_0014c993;
          }
          pcVar9 = "geom tec";
          uVar8 = 0x7ff;
        }
        else {
          pcVar9 = "tatt";
          uVar8 = 0x7fd;
        }
        goto LAB_0014c8d4;
      }
LAB_0014c1a8:
      if (!(bool)(bVar4 | local_54 == 0)) {
        pRVar2 = ref_geom->ref_adj;
        if ((lVar11 < pRVar2->nnode) && (iVar7 = pRVar2->first[lVar11], iVar7 != -1)) {
          bVar14 = false;
          bVar13 = false;
          do {
            bVar4 = true;
            if (!bVar14) {
              bVar4 = bVar13;
            }
            if (ref_geom->descr[(long)pRVar2->item[iVar7].ref * 6] == 2) {
              bVar14 = true;
              bVar13 = bVar4;
            }
            iVar7 = pRVar2->item[iVar7].next;
          } while (iVar7 != -1);
          if ((bVar14) && (!bVar13)) goto LAB_0014c21c;
          if (!bVar14) {
            puts("none found");
          }
          if (bVar13) {
            pcVar9 = "found too many";
            goto LAB_0014c536;
          }
        }
        else {
          pcVar9 = "none found";
LAB_0014c536:
          puts(pcVar9);
        }
        uVar6 = ref_grid_tattle(ref_grid,node);
        if (uVar6 == 0) {
          uVar6 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
          if (uVar6 == 0) {
            pcVar9 = "multiple geom face away from geom edge";
            uVar8 = 0x813;
LAB_0014c993:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar8,"ref_geom_verify_topo",pcVar9);
            return 1;
          }
          pcVar9 = "geom tec";
          uVar8 = 0x812;
        }
        else {
          pcVar9 = "tattle";
          uVar8 = 0x810;
        }
        goto LAB_0014c8d4;
      }
LAB_0014c21c:
      lVar11 = lVar11 + 1;
    } while (lVar11 != local_40);
  }
  ref_cell = ref_grid->cell[0];
  iVar7 = ref_cell->max;
  if (0 < iVar7) {
    iVar10 = 0;
    do {
      lVar12 = (long)iVar10;
      lVar11 = ref_cell->size_per * lVar12;
      node0 = ref_cell->c2n[lVar11];
      if (node0 != -1) {
        uVar6 = ref_cell_list_with2(ref_cell,node0,ref_cell->c2n[lVar11 + 1],2,&local_58,&local_48);
        if (uVar6 != 0) {
          pcVar9 = "edge list for edge";
          uVar8 = 0x821;
          goto LAB_0014c8d4;
        }
        if (local_58 == 2) {
          puts("error: two edg found with same nodes");
          pRVar3 = ref_cell->c2n;
          lVar11 = (long)ref_cell->size_per * (long)local_48;
          printf("edg %d n %d %d id %d\n",(long)local_48,(ulong)(uint)pRVar3[lVar11],
                 (ulong)(uint)pRVar3[lVar11 + 1],(ulong)(uint)pRVar3[lVar11 + 2]);
          pRVar3 = ref_cell->c2n;
          lVar11 = (long)ref_cell->size_per * (long)local_44;
          printf("edg %d n %d %d id %d\n",(long)local_44,(ulong)(uint)pRVar3[lVar11],
                 (ulong)(uint)pRVar3[lVar11 + 1],(ulong)(uint)pRVar3[lVar11 + 2]);
          uVar6 = ref_grid_tattle(ref_grid,ref_cell->c2n[ref_cell->size_per * lVar12]);
          if (uVar6 != 0) {
            pcVar9 = "tattle";
            uVar8 = 0x82c;
LAB_0014c8d4:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   uVar8,"ref_geom_verify_topo",(ulong)uVar6,pcVar9);
            return uVar6;
          }
          uVar6 = ref_grid_tattle(ref_grid,ref_cell->c2n[ref_cell->size_per * lVar12 + 1]);
          if (uVar6 != 0) {
            pcVar9 = "tattle";
            uVar8 = 0x82d;
            goto LAB_0014c8d4;
          }
          uVar6 = ref_geom_tec_para_shard(ref_grid,"ref_geom_topo_error");
          if (uVar6 != 0) {
            pcVar9 = "geom tec";
            uVar8 = 0x82e;
            goto LAB_0014c8d4;
          }
        }
        if (local_58 != 1) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x830,"ref_geom_verify_topo","expect only one edge cell for two nodes",1,
                 (long)local_58);
          return 1;
        }
        iVar7 = ref_cell->max;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < iVar7);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_verify_topo(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT node;
  REF_INT item, geom;
  REF_BOOL geom_node, geom_edge, geom_face;
  REF_BOOL no_face, no_edge;
  REF_BOOL found_one;
  REF_BOOL found_too_many;
  REF_INT cell, ncell, cell_list[2];

  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (ref_node_valid(ref_node, node)) {
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_NODE, &geom_node), "node");
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_EDGE, &geom_edge), "edge");
      RSS(ref_geom_is_a(ref_geom, node, REF_GEOM_FACE, &geom_face), "face");
      no_face = ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_tr2(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_tr3(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_qua(ref_grid), node);
      no_edge = ref_cell_node_empty(ref_grid_edg(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_ed2(ref_grid), node) &&
                ref_cell_node_empty(ref_grid_ed3(ref_grid), node);
      if (geom_node) {
        if (no_edge && ref_node_owned(ref_node, node)) {
          THROW("geom node missing edge");
        }
        if (no_face && ref_node_owned(ref_node, node)) {
          THROW("geom node missing tri or qua");
        }
      }
      if (geom_edge) {
        if (no_edge && ref_node_owned(ref_node, node)) {
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing edge");
        }
        if (no_face && ref_node_owned(ref_node, node)) {
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing tri or qua");
        }
      }
      if (geom_face) {
        if (no_face && ref_node_owned(ref_node, node)) {
          printf("no face for geom\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom face missing tri or qua");
        }
      }
      if (!no_edge) {
        if (!geom_edge) {
          printf("no geom for edge\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom edge missing for edg");
        }
      }
      if (!no_face) {
        if (!geom_face && !ref_geom_meshlinked(ref_geom)) {
          printf("no geom for face\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("geom face missing tri or qua");
        }
      }
      if (geom_edge && !geom_node) {
        found_one = REF_FALSE;
        found_too_many = REF_FALSE;
        each_ref_geom_having_node(ref_geom, node, item, geom) {
          if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
            if (found_one) found_too_many = REF_TRUE;
            found_one = REF_TRUE;
          }
        }
        if (!found_one || found_too_many) {
          if (!found_one) printf("none found\n");
          if (found_too_many) printf("found too many\n");
          RSS(ref_grid_tattle(ref_grid, node), "tatt");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("multiple geom edge away from geom node");
        }
      }
      if (geom_face && !geom_edge) {
        found_one = REF_FALSE;
        found_too_many = REF_FALSE;
        each_ref_adj_node_item_with_ref(ref_geom_adj(ref_geom), node, item,
                                        geom) {
          if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
            if (found_one) found_too_many = REF_TRUE;
            found_one = REF_TRUE;
          }
        }
        if (!found_one || found_too_many) {
          if (!found_one) printf("none found\n");
          if (found_too_many) printf("found too many\n");
          RSS(ref_grid_tattle(ref_grid, node), "tattle");
          RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"),
              "geom tec");
          THROW("multiple geom face away from geom edge");
        }
      }
    } else {
      if (!ref_adj_empty(ref_geom_adj(ref_geom), node))
        THROW("invalid node has geom");
    }
  }

  ref_cell = ref_grid_edg(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    RSS(ref_cell_list_with2(ref_cell, ref_cell_c2n(ref_cell, 0, cell),
                            ref_cell_c2n(ref_cell, 1, cell), 2, &ncell,
                            cell_list),
        "edge list for edge");
    if (2 == ncell) {
      printf("error: two edg found with same nodes\n");
      printf("edg %d n %d %d id %d\n", cell_list[0],
             ref_cell_c2n(ref_cell, 0, cell_list[0]),
             ref_cell_c2n(ref_cell, 1, cell_list[0]),
             ref_cell_c2n(ref_cell, 2, cell_list[0]));
      printf("edg %d n %d %d id %d\n", cell_list[1],
             ref_cell_c2n(ref_cell, 0, cell_list[1]),
             ref_cell_c2n(ref_cell, 1, cell_list[1]),
             ref_cell_c2n(ref_cell, 2, cell_list[1]));
      RSS(ref_grid_tattle(ref_grid, ref_cell_c2n(ref_cell, 0, cell)), "tattle");
      RSS(ref_grid_tattle(ref_grid, ref_cell_c2n(ref_cell, 1, cell)), "tattle");
      RSS(ref_geom_tec_para_shard(ref_grid, "ref_geom_topo_error"), "geom tec");
    }
    REIS(1, ncell, "expect only one edge cell for two nodes");
  }

  return REF_SUCCESS;
}